

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

int qt_create_pipe(int *pipe)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if (*pipe != -1) {
    qt_safe_close(*pipe);
  }
  if (pipe[1] != -1) {
    qt_safe_close(pipe[1]);
  }
  iVar2 = pipe2(pipe,0x80000);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    qErrnoWarning("QProcess: Cannot create pipe");
    *piVar3 = iVar1;
  }
  return iVar2;
}

Assistant:

static int qt_create_pipe(int *pipe)
{
    if (pipe[0] != -1)
        qt_safe_close(pipe[0]);
    if (pipe[1] != -1)
        qt_safe_close(pipe[1]);
    int pipe_ret = qt_safe_pipe(pipe);
    if (pipe_ret != 0) {
        QScopedValueRollback rollback(errno);
        qErrnoWarning("QProcess: Cannot create pipe");
    }
    return pipe_ret;
}